

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int MBAnalyzeBestUVMode(VP8EncIterator *it)

{
  int iVar1;
  VP8EncIterator *in_RDI;
  int alpha;
  VP8Histogram histo;
  int mode;
  int max_mode;
  int best_mode;
  int smallest_alpha;
  int best_alpha;
  VP8Histogram local_24;
  int local_1c;
  undefined4 local_18;
  int local_14;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  iVar2 = 0;
  local_14 = 0;
  local_18 = 2;
  VP8MakeChroma8Preds((VP8EncIterator *)0xffffffff00000000);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    InitHistogram(&local_24);
    (*VP8CollectHistogram)
              (in_RDI->yuv_in_ + 0x10,in_RDI->yuv_p_ + (int)(uint)VP8UVModeOffsets[local_1c],0x10,
               0x18,&local_24);
    iVar1 = GetAlpha(&local_24);
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
    if ((local_1c == 0) || (iVar1 < iVar2)) {
      local_14 = local_1c;
      iVar2 = iVar1;
    }
  }
  VP8SetIntraUVMode(in_RDI,local_14);
  return iVar3;
}

Assistant:

static int MBAnalyzeBestUVMode(VP8EncIterator* const it) {
  int best_alpha = DEFAULT_ALPHA;
  int smallest_alpha = 0;
  int best_mode = 0;
  const int max_mode = MAX_UV_MODE;
  int mode;

  VP8MakeChroma8Preds(it);
  for (mode = 0; mode < max_mode; ++mode) {
    VP8Histogram histo;
    int alpha;
    InitHistogram(&histo);
    VP8CollectHistogram(it->yuv_in_ + U_OFF_ENC,
                        it->yuv_p_ + VP8UVModeOffsets[mode],
                        16, 16 + 4 + 4, &histo);
    alpha = GetAlpha(&histo);
    if (IS_BETTER_ALPHA(alpha, best_alpha)) {
      best_alpha = alpha;
    }
    // The best prediction mode tends to be the one with the smallest alpha.
    if (mode == 0 || alpha < smallest_alpha) {
      smallest_alpha = alpha;
      best_mode = mode;
    }
  }
  VP8SetIntraUVMode(it, best_mode);
  return best_alpha;
}